

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O2

void MPIX_intra_recv_map(comm_pkg *comm,char *intra_recv_data,void *inter_recv_data,
                        MPI_Datatype mpi_type,MPI_Comm mpi_comm)

{
  int i;
  long lVar1;
  int ctr;
  int type_size;
  int size;
  
  MPI_Type_size(mpi_type,&type_size);
  MPI_Pack_size(comm->recv_data->size_msgs,mpi_type,mpi_comm,&size);
  ctr = 0;
  for (lVar1 = 0; lVar1 < comm->recv_data->size_msgs; lVar1 = lVar1 + 1) {
    MPI_Unpack(intra_recv_data,size,&ctr,
               (void *)((long)type_size * (long)comm->recv_data->indices[lVar1] +
                       (long)inter_recv_data),1,mpi_type,mpi_comm);
  }
  return;
}

Assistant:

static void MPIX_intra_recv_map(comm_pkg* comm, char* intra_recv_data, void* inter_recv_data,
        MPI_Datatype mpi_type, MPI_Comm mpi_comm)
{
    int idx, addr;
    int size, type_size;
    char* char_ptr = reinterpret_cast<char*>(inter_recv_data);
    int* int_ptr = reinterpret_cast<int*>(inter_recv_data);
    MPI_Type_size(mpi_type, &type_size);
    MPI_Pack_size(comm->recv_data->size_msgs, mpi_type, mpi_comm, &size);

    int ctr = 0;
    for (int i = 0; i < comm->recv_data->size_msgs; i++)
    {
        idx = comm->recv_data->indices[i];
        MPI_Unpack(intra_recv_data, size, &ctr, &(char_ptr[idx*type_size]), 
                1, mpi_type, mpi_comm);
    }
}